

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShaderGenerator.cpp
# Opt level: O0

void __thiscall
rsg::ShaderGenerator::generate
          (ShaderGenerator *this,ShaderParameters *shaderParams,Shader *shader,
          vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *outputs)

{
  GeneratorState *state;
  ConstValueRangeAccess value_00;
  ConstValueRangeAccess value_01;
  ConstValueRangeAccess value_02;
  ConstValueRangeAccess valueRange_00;
  ConstValueRangeAccess valueRange_01;
  ValueEntry *pVVar1;
  bool bVar2;
  Type TVar3;
  deBool dVar4;
  Storage SVar5;
  VariableManager *pVVar6;
  reference ppSVar7;
  char *pcVar8;
  Variable *pVVar9;
  VariableType *pVVar10;
  Function *this_00;
  reference ppVVar11;
  BlockStatement *block;
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *pvVar12;
  iterator __first;
  iterator __last;
  iterator __i;
  ShaderInput *pSVar13;
  vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_> *pvVar14;
  vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_> *this_01;
  size_type sVar15;
  DeclarationStatement *this_02;
  reference ppVVar16;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *pvVar17;
  ProgramParameters *pPVar18;
  insert_iterator<std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_> __result;
  string local_730 [32];
  undefined1 local_710 [8];
  PrettyPrinter printer;
  ostringstream str;
  undefined1 local_568 [8];
  TokenStream tokenStr;
  DeclarationStatement *local_540;
  __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_538;
  __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_530;
  iterator i_3;
  ConstValueRangeAccess local_520;
  ShaderInput *local_508;
  ValueEntry *local_500;
  ValueEntry *value_1;
  Scalar *pSStack_4f0;
  Scalar *local_4e8;
  ShaderInput *local_4e0;
  ValueEntry *local_4d8;
  ValueEntry *value;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *uniforms;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *inputs;
  char *pcStack_4b8;
  bool declare;
  char *name;
  Variable *variable_2;
  __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_4a0;
  iterator i_2;
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> createDeclarationStatementVars;
  undefined1 local_448 [8];
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> liveVariables;
  undefined8 uStack_428;
  Scalar *local_420;
  ConstStridedValueAccess<1> local_3f8;
  Vector<float,_4> local_3e8;
  ConstStridedValueAccess<1> local_3d8;
  Vector<float,_4> local_3c8;
  undefined1 local_3b8 [8];
  ValueRange valueRange_1;
  Variable *qpPosVariable;
  Variable *local_290;
  Variable *glPosVariable;
  Variable *local_280;
  Variable *variable_1;
  __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_270;
  const_iterator i_1;
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *liveVars;
  FunctionGenerator funcGen;
  Function *main;
  Scalar *pSStack_1d8;
  Scalar *local_1d0;
  Function *local_1c8;
  Scalar *pSStack_1c0;
  Scalar *local_1b8;
  ConstStridedValueAccess<1> local_1b0;
  Vector<float,_4> local_1a0;
  ConstStridedValueAccess<1> local_190;
  Vector<float,_4> local_180;
  undefined1 local_170 [8];
  ValueRange valueRange;
  Variable *fragColorVar;
  ConstValueRangeAccess local_90;
  Variable *local_78;
  Variable *variable;
  ShaderInput *input;
  __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
  local_60;
  const_iterator i;
  ReservedScalars reservedScalars;
  undefined1 local_48 [8];
  ValueScope globalValueScope;
  VariableScope *globalVariableScope;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *outputs_local;
  Shader *shader_local;
  ShaderParameters *shaderParams_local;
  ShaderGenerator *this_local;
  
  globalValueScope.m_entries.
  super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)Shader::getGlobalScope(shader);
  ValueScope::ValueScope((ValueScope *)local_48);
  GeneratorState::setShader(this->m_state,shaderParams,shader);
  ReservedScalars::ReservedScalars((ReservedScalars *)&i);
  TVar3 = Shader::getType(shader);
  if (TVar3 == TYPE_VERTEX) {
    pVVar6 = GeneratorState::getVariableManager(this->m_state);
    VariableManager::reserve(pVVar6,(ReservedScalars *)&i,8);
  }
  VariableManager::pushVariableScope
            (&this->m_varManager,
             (VariableScope *)
             globalValueScope.m_entries.
             super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  VariableManager::pushValueScope(&this->m_varManager,(ValueScope *)local_48);
  local_60._M_current =
       (ShaderInput **)
       std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::begin(outputs);
  while( true ) {
    input = (ShaderInput *)
            std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::end(outputs);
    bVar2 = __gnu_cxx::operator!=
                      (&local_60,
                       (__normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
                        *)&input);
    if (!bVar2) break;
    ppSVar7 = __gnu_cxx::
              __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
              ::operator*(&local_60);
    variable = (Variable *)*ppSVar7;
    pVVar6 = GeneratorState::getVariableManager(this->m_state);
    pVVar9 = ShaderInput::getVariable((ShaderInput *)variable);
    pVVar10 = Variable::getType(pVVar9);
    pVVar9 = ShaderInput::getVariable((ShaderInput *)variable);
    pcVar8 = Variable::getName(pVVar9);
    local_78 = VariableManager::allocate(pVVar6,pVVar10,STORAGE_SHADER_OUT,pcVar8);
    pVVar6 = GeneratorState::getVariableManager(this->m_state);
    pVVar9 = local_78;
    ShaderInput::getValueRange(&local_90,(ShaderInput *)variable);
    value_00.m_min = local_90.m_min;
    value_00.m_type = local_90.m_type;
    value_00.m_max = local_90.m_max;
    VariableManager::setValue(pVVar6,pVVar9,value_00);
    __gnu_cxx::
    __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
    ::operator++(&local_60,0);
  }
  TVar3 = Shader::getType(shader);
  if (TVar3 == TYPE_FRAGMENT) {
    pVVar6 = GeneratorState::getVariableManager(this->m_state);
    VariableType::VariableType
              ((VariableType *)
               &valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,TYPE_FLOAT,4);
    pcVar8 = anon_unknown_27::getFragColorName(this->m_state);
    pVVar9 = VariableManager::allocate
                       (pVVar6,(VariableType *)
                               &valueRange.m_max.
                                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,STORAGE_SHADER_OUT
                        ,pcVar8);
    VariableType::~VariableType
              ((VariableType *)
               &valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    pVVar10 = Variable::getType(pVVar9);
    ValueRange::ValueRange((ValueRange *)local_170,pVVar10);
    tcu::Vector<float,_4>::Vector(&local_180,0.0,0.0,0.0,0.0);
    local_190 = (ConstStridedValueAccess<1>)ValueRange::getMin((ValueRange *)local_170);
    StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_190,&local_180);
    tcu::Vector<float,_4>::Vector(&local_1a0,1.0,1.0,1.0,1.0);
    local_1b0 = (ConstStridedValueAccess<1>)ValueRange::getMax((ValueRange *)local_170);
    StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_1b0,&local_1a0);
    Variable::setLayoutLocation(pVVar9,0);
    pVVar6 = GeneratorState::getVariableManager(this->m_state);
    ValueRange::asAccess((ValueRangeAccess *)&main,(ValueRange *)local_170);
    local_1b8 = local_1d0;
    local_1c8 = main;
    pSStack_1c0 = pSStack_1d8;
    value_01.m_min = pSStack_1d8;
    value_01.m_type = (VariableType *)main;
    value_01.m_max = local_1d0;
    VariableManager::setValue(pVVar6,pVVar9,value_01);
    ValueRange::~ValueRange((ValueRange *)local_170);
  }
  this_00 = Shader::getMain(shader);
  VariableType::VariableType
            ((VariableType *)
             &funcGen.m_requiredAssignments.
              super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,TYPE_VOID,0);
  Function::setReturnType
            (this_00,(VariableType *)
                     &funcGen.m_requiredAssignments.
                      super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  VariableType::~VariableType
            ((VariableType *)
             &funcGen.m_requiredAssignments.
              super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if ((shaderParams->randomize & 1U) == 0) {
    TVar3 = Shader::getType(shader);
    if (TVar3 == TYPE_VERTEX) {
      anon_unknown_27::genVertexPassthrough(this->m_state,shader);
    }
    else {
      anon_unknown_27::genFragmentPassthrough(this->m_state,shader);
    }
  }
  else {
    FunctionGenerator::FunctionGenerator((FunctionGenerator *)&liveVars,this->m_state,this_00);
    i_1._M_current =
         (Variable **)
         VariableScope::getLiveVariables
                   ((VariableScope *)
                    globalValueScope.m_entries.
                    super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_270._M_current =
         (Variable **)
         std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::begin
                   ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)i_1._M_current);
    while( true ) {
      variable_1 = (Variable *)
                   std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::end
                             ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)
                              i_1._M_current);
      bVar2 = __gnu_cxx::operator!=
                        (&local_270,
                         (__normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
                          *)&variable_1);
      if (!bVar2) break;
      ppVVar11 = __gnu_cxx::
                 __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
                 ::operator*(&local_270);
      local_280 = *ppVVar11;
      SVar5 = Variable::getStorage(local_280);
      if (SVar5 == STORAGE_SHADER_OUT) {
        FunctionGenerator::requireAssignment((FunctionGenerator *)&liveVars,local_280);
      }
      glPosVariable =
           (Variable *)
           __gnu_cxx::
           __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
           ::operator++(&local_270,0);
    }
    FunctionGenerator::generate((FunctionGenerator *)&liveVars);
    FunctionGenerator::~FunctionGenerator((FunctionGenerator *)&liveVars);
  }
  TVar3 = Shader::getType(shader);
  if (TVar3 == TYPE_VERTEX) {
    pVVar6 = GeneratorState::getVariableManager(this->m_state);
    VariableManager::release(pVVar6,(ReservedScalars *)&i);
    pVVar6 = GeneratorState::getVariableManager(this->m_state);
    VariableType::VariableType((VariableType *)&qpPosVariable,TYPE_FLOAT,4);
    pVVar9 = VariableManager::allocate
                       (pVVar6,(VariableType *)&qpPosVariable,STORAGE_SHADER_OUT,"gl_Position");
    VariableType::~VariableType((VariableType *)&qpPosVariable);
    local_290 = pVVar9;
    pVVar6 = GeneratorState::getVariableManager(this->m_state);
    VariableType::VariableType
              ((VariableType *)
               &valueRange_1.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,TYPE_FLOAT,4);
    pVVar9 = VariableManager::allocate
                       (pVVar6,(VariableType *)
                               &valueRange_1.m_max.
                                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,STORAGE_SHADER_IN,
                        "dEQP_Position");
    VariableType::~VariableType
              ((VariableType *)
               &valueRange_1.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    pVVar10 = Variable::getType(local_290);
    ValueRange::ValueRange((ValueRange *)local_3b8,pVVar10);
    tcu::Vector<float,_4>::Vector(&local_3c8,-1.0,-1.0,0.0,1.0);
    local_3d8 = (ConstStridedValueAccess<1>)ValueRange::getMin((ValueRange *)local_3b8);
    StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_3d8,&local_3c8);
    tcu::Vector<float,_4>::Vector(&local_3e8,1.0,1.0,0.0,1.0);
    local_3f8 = (ConstStridedValueAccess<1>)ValueRange::getMax((ValueRange *)local_3b8);
    StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_3f8,&local_3e8);
    pVVar6 = GeneratorState::getVariableManager(this->m_state);
    ValueRange::asAccess
              ((ValueRangeAccess *)
               &liveVariables.super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(ValueRange *)local_3b8);
    value_02.m_min = (Scalar *)uStack_428;
    value_02.m_type =
         (VariableType *)
         liveVariables.super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    value_02.m_max = local_420;
    VariableManager::setValue(pVVar6,pVVar9,value_02);
    block = Function::getBody(this_00);
    anon_unknown_27::createAssignment(block,local_290,pVVar9);
    ValueRange::~ValueRange((ValueRange *)local_3b8);
  }
  std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::vector
            ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)local_448);
  pvVar12 = VariableScope::getLiveVariables
                      ((VariableScope *)
                       globalValueScope.m_entries.
                       super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  __first = std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::begin(pvVar12);
  pvVar12 = VariableScope::getLiveVariables
                      ((VariableScope *)
                       globalValueScope.m_entries.
                       super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  __last = std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::end(pvVar12);
  __i = std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::begin
                  ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)local_448);
  __result = std::inserter<std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>>
                       ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)local_448,__i);
  std::
  copy<__gnu_cxx::__normal_iterator<rsg::Variable**,std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>>,std::insert_iterator<std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>>>
            ((__normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
              )__first._M_current,
             (__normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
              )__last._M_current,__result);
  std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::vector
            ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)&i_2);
  local_4a0._M_current =
       (Variable **)
       std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::begin
                 ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)local_448);
  while( true ) {
    variable_2 = (Variable *)
                 std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::end
                           ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)local_448);
    bVar2 = __gnu_cxx::operator!=
                      (&local_4a0,
                       (__normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
                        *)&variable_2);
    if (!bVar2) break;
    ppVVar16 = __gnu_cxx::
               __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
               ::operator*(&local_4a0);
    name = (char *)*ppVVar16;
    pcStack_4b8 = Variable::getName((Variable *)name);
    dVar4 = deStringBeginsWith(pcStack_4b8,"gl_");
    inputs._7_1_ = dVar4 == 0;
    uniforms = Shader::getInputs(shader);
    value = (ValueEntry *)Shader::getUniforms(shader);
    SVar5 = Variable::getStorage((Variable *)name);
    if (SVar5 == STORAGE_SHADER_IN) {
      pVVar6 = GeneratorState::getVariableManager(this->m_state);
      local_4d8 = VariableManager::getValue(pVVar6,(Variable *)name);
      pvVar17 = uniforms;
      sVar15 = std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::size(uniforms);
      std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::reserve
                (pvVar17,sVar15 + 1);
      pvVar17 = uniforms;
      pSVar13 = (ShaderInput *)operator_new(0x38);
      pcVar8 = name;
      ValueEntry::getValueRange((ConstValueRangeAccess *)&value_1,local_4d8);
      valueRange_00.m_min = pSStack_4f0;
      valueRange_00.m_type = (VariableType *)value_1;
      valueRange_00.m_max = local_4e8;
      ShaderInput::ShaderInput(pSVar13,(Variable *)pcVar8,valueRange_00);
      local_4e0 = pSVar13;
      std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::push_back
                (pvVar17,&local_4e0);
    }
    else if (SVar5 == STORAGE_UNIFORM) {
      pVVar6 = GeneratorState::getVariableManager(this->m_state);
      local_500 = VariableManager::getValue(pVVar6,(Variable *)name);
      pVVar1 = value;
      sVar15 = std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::size
                         ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)value);
      std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::reserve
                ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)pVVar1,
                 sVar15 + 1);
      pVVar1 = value;
      pSVar13 = (ShaderInput *)operator_new(0x38);
      pcVar8 = name;
      ValueEntry::getValueRange(&local_520,local_500);
      valueRange_01.m_min = local_520.m_min;
      valueRange_01.m_type = local_520.m_type;
      valueRange_01.m_max = local_520.m_max;
      ShaderInput::ShaderInput(pSVar13,(Variable *)pcVar8,valueRange_01);
      local_508 = pSVar13;
      std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::push_back
                ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)pVVar1,
                 &local_508);
    }
    if ((inputs._7_1_ & 1) == 0) {
      pVVar6 = GeneratorState::getVariableManager(this->m_state);
      VariableManager::declareVariable(pVVar6,(Variable *)name);
    }
    else {
      std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::push_back
                ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)&i_2,
                 (value_type *)&name);
    }
    i_3._M_current =
         (Variable **)
         __gnu_cxx::
         __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
         ::operator++(&local_4a0,0);
  }
  GeneratorState::pushExpressionFlags(this->m_state,3);
  local_530._M_current =
       (Variable **)
       std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::begin
                 ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)&i_2);
  while( true ) {
    local_538._M_current =
         (Variable **)
         std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::end
                   ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)&i_2);
    bVar2 = __gnu_cxx::operator!=(&local_530,&local_538);
    if (!bVar2) break;
    pvVar14 = Shader::getGlobalStatements(shader);
    this_01 = Shader::getGlobalStatements(shader);
    sVar15 = std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::size(this_01);
    std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::reserve(pvVar14,sVar15);
    pvVar14 = Shader::getGlobalStatements(shader);
    this_02 = (DeclarationStatement *)operator_new(0x18);
    state = this->m_state;
    ppVVar16 = __gnu_cxx::
               __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
               ::operator*(&local_530);
    DeclarationStatement::DeclarationStatement(this_02,state,*ppVVar16);
    local_540 = this_02;
    std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::push_back
              (pvVar14,(value_type *)&local_540);
    tokenStr.m_numTokens =
         (size_t)__gnu_cxx::
                 __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
                 ::operator++(&local_530,0);
  }
  GeneratorState::popExpressionFlags(this->m_state);
  std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::~vector
            ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)&i_2);
  std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::~vector
            ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)local_448);
  VariableManager::popVariableScope(&this->m_varManager);
  VariableManager::popValueScope(&this->m_varManager);
  pvVar17 = Shader::getInputs(shader);
  anon_unknown_27::fillUndefinedShaderInputs(pvVar17);
  pvVar17 = Shader::getUniforms(shader);
  anon_unknown_27::fillUndefinedShaderInputs(pvVar17);
  TokenStream::TokenStream((TokenStream *)local_568);
  Shader::tokenize(shader,this->m_state,(TokenStream *)local_568);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&printer.m_indentDepth);
  PrettyPrinter::PrettyPrinter((PrettyPrinter *)local_710,(ostringstream *)&printer.m_indentDepth);
  pPVar18 = GeneratorState::getProgramParameters(this->m_state);
  if (pPVar18->version == VERSION_300) {
    std::operator<<((ostream *)&printer.m_indentDepth,"#version 300 es\n");
  }
  PrettyPrinter::append((PrettyPrinter *)local_710,(TokenStream *)local_568);
  std::__cxx11::ostringstream::str();
  pcVar8 = (char *)std::__cxx11::string::c_str();
  Shader::setSource(shader,pcVar8);
  std::__cxx11::string::~string(local_730);
  PrettyPrinter::~PrettyPrinter((PrettyPrinter *)local_710);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&printer.m_indentDepth);
  TokenStream::~TokenStream((TokenStream *)local_568);
  ValueScope::~ValueScope((ValueScope *)local_48);
  return;
}

Assistant:

void ShaderGenerator::generate (const ShaderParameters& shaderParams, Shader& shader, const vector<ShaderInput*>& outputs)
{
	// Global scopes
	VariableScope&	globalVariableScope	= shader.getGlobalScope();
	ValueScope		globalValueScope;

	// Init state
	m_state.setShader(shaderParams, shader);
	DE_ASSERT(m_state.getExpressionFlags() == 0);

	// Reserve some scalars for gl_Position & dEQP_Position
	ReservedScalars reservedScalars;
	if (shader.getType() == Shader::TYPE_VERTEX)
		m_state.getVariableManager().reserve(reservedScalars, 4*2);

	// Push global scopes
	m_varManager.pushVariableScope(globalVariableScope);
	m_varManager.pushValueScope(globalValueScope);

	// Init shader outputs.
	{
		for (vector<ShaderInput*>::const_iterator i = outputs.begin(); i != outputs.end(); i++)
		{
			const ShaderInput*	input		= *i;
			Variable*			variable	= m_state.getVariableManager().allocate(input->getVariable()->getType(), Variable::STORAGE_SHADER_OUT, input->getVariable()->getName());

			m_state.getVariableManager().setValue(variable, input->getValueRange());
		}

		if (shader.getType() == Shader::TYPE_FRAGMENT)
		{
			// gl_FragColor
			// \todo [2011-11-22 pyry] Multiple outputs from fragment shader!
			Variable*	fragColorVar	= m_state.getVariableManager().allocate(VariableType(VariableType::TYPE_FLOAT, 4), Variable::STORAGE_SHADER_OUT, getFragColorName(m_state));
			ValueRange	valueRange(fragColorVar->getType());

			valueRange.getMin() = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
			valueRange.getMax() = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);

			fragColorVar->setLayoutLocation(0); // Bind color output to location 0 (applies to GLSL ES 3.0 onwards).

			m_state.getVariableManager().setValue(fragColorVar, valueRange.asAccess());
		}
	}

	// Construct shader code.
	{
		Function& main = shader.getMain();
		main.setReturnType(VariableType(VariableType::TYPE_VOID));

		if (shaderParams.randomize)
		{
			FunctionGenerator funcGen(m_state, main);

			// Mandate assignment into to all shader outputs in main()
			const vector<Variable*>& liveVars = globalVariableScope.getLiveVariables();
			for (vector<Variable*>::const_iterator i = liveVars.begin(); i != liveVars.end(); i++)
			{
				Variable* variable = *i;
				if (variable->getStorage() == Variable::STORAGE_SHADER_OUT)
					funcGen.requireAssignment(variable);
			}

			funcGen.generate();
		}
		else
		{
			if (shader.getType() == Shader::TYPE_VERTEX)
				genVertexPassthrough(m_state, shader);
			else
			{
				DE_ASSERT(shader.getType() == Shader::TYPE_FRAGMENT);
				genFragmentPassthrough(m_state, shader);
			}
		}

		if (shader.getType() == Shader::TYPE_VERTEX)
		{
			// Add gl_Position = dEQP_Position;
			m_state.getVariableManager().release(reservedScalars);

			Variable* glPosVariable = m_state.getVariableManager().allocate(VariableType(VariableType::TYPE_FLOAT, 4), Variable::STORAGE_SHADER_OUT, "gl_Position");
			Variable* qpPosVariable = m_state.getVariableManager().allocate(VariableType(VariableType::TYPE_FLOAT, 4), Variable::STORAGE_SHADER_IN, "dEQP_Position");

			ValueRange valueRange(glPosVariable->getType());

			valueRange.getMin() = tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f);
			valueRange.getMax() = tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f);

			m_state.getVariableManager().setValue(qpPosVariable, valueRange.asAccess()); // \todo [2011-05-24 pyry] No expression should be able to use gl_Position or dEQP_Position..

			createAssignment(main.getBody(), glPosVariable, qpPosVariable);
		}
	}

	// Declare live global variables.
	{
		vector<Variable*> liveVariables;
		std::copy(globalVariableScope.getLiveVariables().begin(), globalVariableScope.getLiveVariables().end(), std::inserter(liveVariables, liveVariables.begin()));

		vector<Variable*> createDeclarationStatementVars;

		for (vector<Variable*>::iterator i = liveVariables.begin(); i != liveVariables.end(); i++)
		{
			Variable*		variable	= *i;
			const char*		name		= variable->getName();
			bool			declare		= !deStringBeginsWith(name, "gl_"); // Do not declare built-in types.

			// Create input entries (store value range) if necessary
			vector<ShaderInput*>& inputs	= shader.getInputs();
			vector<ShaderInput*>& uniforms	= shader.getUniforms();

			switch (variable->getStorage())
			{
				case Variable::STORAGE_SHADER_IN:
				{
					const ValueEntry* value = m_state.getVariableManager().getValue(variable);

					inputs.reserve(inputs.size()+1);
					inputs.push_back(new ShaderInput(variable, value->getValueRange()));
					break;
				}

				case Variable::STORAGE_UNIFORM:
				{
					const ValueEntry* value = m_state.getVariableManager().getValue(variable);

					uniforms.reserve(uniforms.size()+1);
					uniforms.push_back(new ShaderInput(variable, value->getValueRange()));
					break;
				}

				default:
					break;
			}

			if (declare)
				createDeclarationStatementVars.push_back(variable);
			else
			{
				// Just move to global scope without declaration statement.
				m_state.getVariableManager().declareVariable(variable);
			}
		}

		// All global initializers must be constant expressions, no variable allocation is allowed
		DE_ASSERT(m_state.getExpressionFlags() == 0);
		m_state.pushExpressionFlags(CONST_EXPR|NO_VAR_ALLOCATION);

		// Create declaration statements
		for (vector<Variable*>::iterator i = createDeclarationStatementVars.begin(); i != createDeclarationStatementVars.end(); i++)
		{
			shader.getGlobalStatements().reserve(shader.getGlobalStatements().size());
			shader.getGlobalStatements().push_back(new DeclarationStatement(m_state, *i));
		}

		m_state.popExpressionFlags();
	}

	// Pop global scopes
	m_varManager.popVariableScope();
	m_varManager.popValueScope();

	// Fill undefined (unused) components in inputs with dummy values
	fillUndefinedShaderInputs(shader.getInputs());
	fillUndefinedShaderInputs(shader.getUniforms());

	// Tokenize shader and write source
	{
		TokenStream tokenStr;
		shader.tokenize(m_state, tokenStr);

		std::ostringstream	str;
		PrettyPrinter		printer(str);

		// Append #version if necessary.
		if (m_state.getProgramParameters().version == VERSION_300)
			str << "#version 300 es\n";

		printer.append(tokenStr);
		shader.setSource(str.str().c_str());
	}
}